

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layered_toon_shader.cpp
# Opt level: O3

void vec3_layer(float *r,float *maxr,float max_n,float n)

{
  int i;
  long lVar1;
  float fVar2;
  vec3 cadd;
  
  r[0] = 0.0;
  r[1] = 0.0;
  r[2] = 0.0;
  lVar1 = 0;
  do {
    cadd[lVar1] = maxr[lVar1] * (1.0 / max_n);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  for (fVar2 = 0.0; fVar2 < n; fVar2 = fVar2 + 1.0) {
    lVar1 = 0;
    do {
      r[lVar1] = r[lVar1] + cadd[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
  }
  return;
}

Assistant:

void vec3_layer(vec3 r, const vec3 maxr, const float max_n, const float n){
    //set to lowest layer color
    r[0] = 0.0f;
    r[1] = 0.0f;
    r[2] = 0.0f;

    //a color add for each layer
    vec3 cadd;
    vec3_scale(cadd, maxr, 1/max_n);

    //cal current layer color
    for(float i=0.0f; i<n; i+=1.0f){
        vec3_add(r, r, cadd);
    }
}